

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase471::run(TestCase471 *this)

{
  Builder value;
  Builder value_00;
  Builder value_01;
  Builder value_02;
  Builder value_03;
  Builder value_04;
  Builder value_05;
  Builder value_06;
  Builder value_07;
  Builder value_08;
  Builder value_09;
  Builder value_10;
  Builder value_11;
  Builder value_12;
  Builder value_13;
  Builder value_14;
  Builder value_15;
  Builder value_16;
  Builder value_17;
  Builder value_18;
  initializer_list<int> value_19;
  initializer_list<int> value_20;
  initializer_list<int> value_21;
  Reader value_22;
  Reader value_23;
  Reader value_24;
  Reader value_25;
  Reader value_26;
  Reader value_27;
  Builder root;
  Builder l8;
  undefined1 in_stack_fffffffffffffa60 [16];
  undefined1 auVar1 [16];
  undefined1 in_stack_fffffffffffffa70 [32];
  ArrayDisposer *pAStack_570;
  DebugComparison<const_char_(&)[149],_kj::String> _kjCondition;
  Array<char> local_528;
  char *local_510;
  Builder list;
  Builder local_180;
  Builder local_148;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestPrintInlineStructs>
            (&root,&builder.super_MessageBuilder);
  capnproto_test::capnp::test::TestPrintInlineStructs::Builder::initStructList(&list,&root,3);
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition,&list.builder,0);
  *(undefined4 *)_kjCondition.right.content.size_ = 0x7b;
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition,&list.builder,0);
  value_22.super_StringPtr.content.size_ = 4;
  value_22.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestPrintInlineStructs::InlineStruct::Builder::setTextField
            ((Builder *)&_kjCondition,value_22);
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition,&list.builder,1);
  *(undefined4 *)_kjCondition.right.content.size_ = 0x1c8;
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition,&list.builder,1);
  value_23.super_StringPtr.content.size_ = 4;
  value_23.super_StringPtr.content.ptr = "bar";
  capnproto_test::capnp::test::TestPrintInlineStructs::InlineStruct::Builder::setTextField
            ((Builder *)&_kjCondition,value_23);
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition,&list.builder,2);
  *(undefined4 *)_kjCondition.right.content.size_ = 0x315;
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition,&list.builder,2);
  value_24.super_StringPtr.content.size_ = 4;
  value_24.super_StringPtr.content.ptr = "baz";
  capnproto_test::capnp::test::TestPrintInlineStructs::InlineStruct::Builder::setTextField
            ((Builder *)&_kjCondition,value_24);
  local_528.ptr =
       "( structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
  ;
  value.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
  value.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
  value.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
  value.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
  value.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
  value.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
  value.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
  value.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
  prettyPrint(value);
  kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
  kj::_::DebugExpression<char_const(&)[149]>::operator==
            (&_kjCondition,(DebugExpression<char_const(&)[149]> *)&local_528,(String *)&l8);
  kj::Array<char>::~Array((Array<char> *)&l8);
  kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    value_00.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
    value_00.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
    value_00.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
    value_00.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
    value_00.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
    value_00.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
    value_00.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
    value_00.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
    prettyPrint(value_00);
    kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
    kj::_::Debug::
    log<char_const(&)[221],kj::_::DebugComparison<char_const(&)[149],kj::String>&,char_const(&)[149],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x1ea,ERROR,
               "\"failed: expected \" \"(\\\"( structList = [\\\\n\\\" \\\"    (int32Field = 123, textField = \\\\\\\"foo\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 456, textField = \\\\\\\"bar\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 789, textField = \\\\\\\"baz\\\\\\\") ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\", prettyPrint(root).flatten()"
               ,(char (*) [221])
                "failed: expected (\"( structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\") == (prettyPrint(root).flatten())"
               ,&_kjCondition,
               (char (*) [149])
               "( structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
               ,(String *)&l8);
    kj::Array<char>::~Array((Array<char> *)&l8);
    kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  value_25.super_StringPtr.content.size_ = 4;
  value_25.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestPrintInlineStructs::Builder::setSomeText(&root,value_25);
  local_528.ptr =
       "( someText = \"foo\",\n  structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
  ;
  value_01.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
  value_01.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
  value_01.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
  value_01.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
  value_01.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
  value_01.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
  value_01.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
  value_01.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
  prettyPrint(value_01);
  kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
  kj::_::DebugExpression<char_const(&)[169]>::operator==
            ((DebugComparison<const_char_(&)[169],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[169]> *)&local_528,(String *)&l8);
  kj::Array<char>::~Array((Array<char> *)&l8);
  kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    value_02.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
    value_02.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
    value_02.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
    value_02.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
    value_02.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
    value_02.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
    value_02.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
    value_02.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
    prettyPrint(value_02);
    kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
    kj::_::Debug::
    log<char_const(&)[247],kj::_::DebugComparison<char_const(&)[169],kj::String>&,char_const(&)[169],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,500,ERROR,
               "\"failed: expected \" \"(\\\"( someText = \\\\\\\"foo\\\\\\\",\\\\n\\\" \\\"  structList = [\\\\n\\\" \\\"    (int32Field = 123, textField = \\\\\\\"foo\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 456, textField = \\\\\\\"bar\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 789, textField = \\\\\\\"baz\\\\\\\") ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( someText = \\\"foo\\\",\\n\" \"  structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\", prettyPrint(root).flatten()"
               ,(char (*) [247])
                "failed: expected (\"( someText = \\\"foo\\\",\\n\" \"  structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[169],_kj::String> *)&_kjCondition,
               (char (*) [169])
               "( someText = \"foo\",\n  structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
               ,(String *)&l8);
    kj::Array<char>::~Array((Array<char> *)&l8);
    kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestLists>
            ((Builder *)&root,&builder.super_MessageBuilder);
  capnproto_test::capnp::test::TestLists::Builder::initInt32ListList
            ((Builder *)&list,(Builder *)&root,3);
  _kjCondition.left = (char (*) [149])0x1c80000007b;
  _kjCondition.right.content.ptr = (char *)0x499602d200000315;
  value_19._M_len = 4;
  value_19._M_array = (iterator)&_kjCondition;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set((Builder *)&list,0,value_19);
  _kjCondition.left = (char (*) [149])0x237000000ea;
  _kjCondition.right.content.ptr = (char *)0x499602d20000037b;
  value_20._M_len = 4;
  value_20._M_array = (iterator)&_kjCondition;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set((Builder *)&list,1,value_20);
  _kjCondition.left = (char (*) [149])0x2a600000159;
  _kjCondition.right.content.ptr = (char *)0x499602d200000390;
  value_21._M_len = 4;
  value_21._M_array = (iterator)&_kjCondition;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set((Builder *)&list,2,value_21);
  local_528.ptr =
       "[ [123, 456, 789, 1234567890],\n  [234, 567, 891, 1234567890],\n  [345, 678, 912, 1234567890] ]"
  ;
  DynamicList::Builder::
  Builder<capnp::List<capnp::List<int,(capnp::Kind)0>,(capnp::Kind)6>::Builder&,void>
            (&local_148,(Builder *)&list);
  value_17.builder.ptr = (byte *)pAStack_570;
  auVar1 = in_stack_fffffffffffffa70._0_16_;
  value_17.schema.elementType.baseType = auVar1._0_2_;
  value_17.schema.elementType.listDepth = auVar1[2];
  value_17.schema.elementType.isImplicitParam = (bool)auVar1[3];
  value_17.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)auVar1._4_2_;
  value_17.schema.elementType._6_2_ = auVar1._6_2_;
  value_17.schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)auVar1._8_8_;
  value_17.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa70._16_8_;
  value_17.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._24_8_;
  value_17.builder._24_8_ = _kjCondition.left;
  value_17.builder._32_8_ = _kjCondition.right.content.ptr;
  prettyPrint(value_17);
  kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
  kj::_::DebugExpression<char_const(&)[94]>::operator==
            ((DebugComparison<const_char_(&)[94],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[94]> *)&local_528,(String *)&l8);
  kj::Array<char>::~Array((Array<char> *)&l8);
  kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    DynamicList::Builder::
    Builder<capnp::List<capnp::List<int,(capnp::Kind)0>,(capnp::Kind)6>::Builder&,void>
              (&local_180,(Builder *)&list);
    value_18.builder.ptr = (byte *)pAStack_570;
    auVar1 = in_stack_fffffffffffffa70._0_16_;
    value_18.schema.elementType.baseType = auVar1._0_2_;
    value_18.schema.elementType.listDepth = auVar1[2];
    value_18.schema.elementType.isImplicitParam = (bool)auVar1[3];
    value_18.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)auVar1._4_2_;
    value_18.schema.elementType._6_2_ = auVar1._6_2_;
    value_18.schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)auVar1._8_8_;
    value_18.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa70._16_8_;
    value_18.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._24_8_;
    value_18.builder._24_8_ = _kjCondition.left;
    value_18.builder._32_8_ = _kjCondition.right.content.ptr;
    prettyPrint(value_18);
    kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
    kj::_::Debug::
    log<char_const(&)[154],kj::_::DebugComparison<char_const(&)[94],kj::String>&,char_const(&)[94],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x202,ERROR,
               "\"failed: expected \" \"(\\\"[ [123, 456, 789, 1234567890],\\\\n\\\" \\\"  [234, 567, 891, 1234567890],\\\\n\\\" \\\"  [345, 678, 912, 1234567890] ]\\\") == (prettyPrint(ll).flatten())\", _kjCondition, \"[ [123, 456, 789, 1234567890],\\n\" \"  [234, 567, 891, 1234567890],\\n\" \"  [345, 678, 912, 1234567890] ]\", prettyPrint(ll).flatten()"
               ,(char (*) [154])
                "failed: expected (\"[ [123, 456, 789, 1234567890],\\n\" \"  [234, 567, 891, 1234567890],\\n\" \"  [345, 678, 912, 1234567890] ]\") == (prettyPrint(ll).flatten())"
               ,(DebugComparison<const_char_(&)[94],_kj::String> *)&_kjCondition,
               (char (*) [94])
               "[ [123, 456, 789, 1234567890],\n  [234, 567, 891, 1234567890],\n  [345, 678, 912, 1234567890] ]"
               ,(String *)&l8);
    kj::Array<char>::~Array((Array<char> *)&l8);
    kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  local_528.ptr =
       "( int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
  ;
  value_03.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
  value_03.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
  value_03.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
  value_03.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
  value_03.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
  value_03.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
  value_03.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
  value_03.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
  prettyPrint(value_03);
  kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
  kj::_::DebugExpression<char_const(&)[122]>::operator==
            ((DebugComparison<const_char_(&)[122],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[122]> *)&local_528,(String *)&l8);
  kj::Array<char>::~Array((Array<char> *)&l8);
  kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    value_04.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
    value_04.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
    value_04.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
    value_04.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
    value_04.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
    value_04.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
    value_04.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
    value_04.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
    prettyPrint(value_04);
    kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
    kj::_::Debug::
    log<char_const(&)[188],kj::_::DebugComparison<char_const(&)[122],kj::String>&,char_const(&)[122],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x209,ERROR,
               "\"failed: expected \" \"(\\\"( int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
               ,(char (*) [188])
                "failed: expected (\"( int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[122],_kj::String> *)&_kjCondition,
               (char (*) [122])
               "( int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
               ,(String *)&l8);
    kj::Array<char>::~Array((Array<char> *)&l8);
    kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  capnproto_test::capnp::test::TestLists::Builder::initList8
            ((Builder *)&_kjCondition,(Builder *)&root,0);
  local_528.ptr =
       "( list8 = [],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
  ;
  value_05.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
  value_05.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
  value_05.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
  value_05.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
  value_05.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
  value_05.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
  value_05.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
  value_05.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
  prettyPrint(value_05);
  kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
  kj::_::DebugExpression<char_const(&)[136]>::operator==
            ((DebugComparison<const_char_(&)[136],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[136]> *)&local_528,(String *)&l8);
  kj::Array<char>::~Array((Array<char> *)&l8);
  kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    value_06.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
    value_06.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
    value_06.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
    value_06.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
    value_06.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
    value_06.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
    value_06.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
    value_06.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
    prettyPrint(value_06);
    kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
    kj::_::Debug::
    log<char_const(&)[206],kj::_::DebugComparison<char_const(&)[136],kj::String>&,char_const(&)[136],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x213,ERROR,
               "\"failed: expected \" \"(\\\"( list8 = [],\\\\n\\\" \\\"  int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( list8 = [],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
               ,(char (*) [206])
                "failed: expected (\"( list8 = [],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[136],_kj::String> *)&_kjCondition,
               (char (*) [136])
               "( list8 = [],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
               ,(String *)&l8);
    kj::Array<char>::~Array((Array<char> *)&l8);
    kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  capnproto_test::capnp::test::TestLists::Builder::initList8(&l8,(Builder *)&root,1);
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition,&l8.builder,0);
  *(undefined1 *)_kjCondition.right.content.size_ = 0xc;
  local_510 = 
  "( list8 = [(f = 12)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
  ;
  value_07.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
  value_07.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
  value_07.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
  value_07.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
  value_07.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
  value_07.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
  value_07.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
  value_07.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
  prettyPrint(value_07);
  kj::StringTree::flatten((String *)&local_528,(StringTree *)&stack0xfffffffffffffa60);
  kj::_::DebugExpression<char_const(&)[144]>::operator==
            ((DebugComparison<const_char_(&)[144],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[144]> *)&local_510,(String *)&local_528);
  kj::Array<char>::~Array(&local_528);
  kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    value_08.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
    value_08.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
    value_08.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
    value_08.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
    value_08.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
    value_08.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
    value_08.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
    value_08.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
    prettyPrint(value_08);
    kj::StringTree::flatten((String *)&local_528,(StringTree *)&stack0xfffffffffffffa60);
    kj::_::Debug::
    log<char_const(&)[214],kj::_::DebugComparison<char_const(&)[144],kj::String>&,char_const(&)[144],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x21e,ERROR,
               "\"failed: expected \" \"(\\\"( list8 = [(f = 12)],\\\\n\\\" \\\"  int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( list8 = [(f = 12)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
               ,(char (*) [214])
                "failed: expected (\"( list8 = [(f = 12)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[144],_kj::String> *)&_kjCondition,
               (char (*) [144])
               "( list8 = [(f = 12)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
               ,(String *)&local_528);
    kj::Array<char>::~Array(&local_528);
    kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  capnproto_test::capnp::test::TestLists::Builder::initList8
            ((Builder *)&_kjCondition,(Builder *)&root,2);
  l8.builder._32_8_ = _kjCondition.op.content.ptr;
  l8.builder.ptr = (byte *)_kjCondition.right.content.size_;
  l8.builder._24_8_ = _kjCondition.right.content.disposer;
  l8.builder.segment = (SegmentBuilder *)_kjCondition.left;
  l8.builder.capTable = (CapTableBuilder *)_kjCondition.right.content.ptr;
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition,&l8.builder,0);
  *(undefined1 *)_kjCondition.right.content.size_ = 0xc;
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition,&l8.builder,1);
  *(undefined1 *)_kjCondition.right.content.size_ = 0x22;
  local_510 = 
  "( list8 = [(f = 12), (f = 34)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
  ;
  value_09.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
  value_09.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
  value_09.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
  value_09.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
  value_09.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
  value_09.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
  value_09.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
  value_09.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
  prettyPrint(value_09);
  kj::StringTree::flatten((String *)&local_528,(StringTree *)&stack0xfffffffffffffa60);
  kj::_::DebugExpression<char_const(&)[154]>::operator==
            ((DebugComparison<const_char_(&)[154],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[154]> *)&local_510,(String *)&local_528);
  kj::Array<char>::~Array(&local_528);
  kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    value_10.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
    value_10.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
    value_10.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
    value_10.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
    value_10.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
    value_10.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
    value_10.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
    value_10.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
    prettyPrint(value_10);
    kj::StringTree::flatten((String *)&local_528,(StringTree *)&stack0xfffffffffffffa60);
    kj::_::Debug::
    log<char_const(&)[224],kj::_::DebugComparison<char_const(&)[154],kj::String>&,char_const(&)[154],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x22a,ERROR,
               "\"failed: expected \" \"(\\\"( list8 = [(f = 12), (f = 34)],\\\\n\\\" \\\"  int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( list8 = [(f = 12), (f = 34)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
               ,(char (*) [224])
                "failed: expected (\"( list8 = [(f = 12), (f = 34)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[154],_kj::String> *)&_kjCondition,
               (char (*) [154])
               "( list8 = [(f = 12), (f = 34)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
               ,(String *)&local_528);
    kj::Array<char>::~Array(&local_528);
    kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestStructUnion>
            ((Builder *)&root,&builder.super_MessageBuilder);
  _kjCondition.op.content.ptr = (char *)root._builder._32_8_;
  _kjCondition.right.content.size_ = (size_t)root._builder.data;
  _kjCondition.right.content.disposer = (ArrayDisposer *)root._builder.pointers;
  _kjCondition.left = (char (*) [149])root._builder.segment;
  _kjCondition.right.content.ptr = (char *)root._builder.capTable;
  capnproto_test::capnp::test::TestStructUnion::Un::Builder::initStruct
            ((Builder *)&list,(Builder *)&_kjCondition);
  local_528.ptr = "(un = (struct = ()))";
  value_11.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
  value_11.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
  value_11.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
  value_11.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
  value_11.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
  value_11.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
  value_11.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
  value_11.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
  prettyPrint(value_11);
  kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
  kj::_::DebugExpression<char_const(&)[21]>::operator==
            ((DebugComparison<const_char_(&)[21],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[21]> *)&local_528,(String *)&l8);
  kj::Array<char>::~Array((Array<char> *)&l8);
  kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    value_12.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
    value_12.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
    value_12.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
    value_12.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
    value_12.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
    value_12.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
    value_12.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
    value_12.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
    prettyPrint(value_12);
    kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
    kj::_::Debug::
    log<char_const(&)[75],kj::_::DebugComparison<char_const(&)[21],kj::String>&,char_const(&)[21],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(\\\"(un = (struct = ()))\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"(un = (struct = ()))\", prettyPrint(root).flatten()"
               ,(char (*) [75])
                "failed: expected (\"(un = (struct = ()))\") == (prettyPrint(root).flatten())",
               (DebugComparison<const_char_(&)[21],_kj::String> *)&_kjCondition,
               (char (*) [21])"(un = (struct = ()))",(String *)&l8);
    kj::Array<char>::~Array((Array<char> *)&l8);
    kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  value_26.super_StringPtr.content.size_ = 4;
  value_26.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestStructUnion::SomeStruct::Builder::setSomeText
            ((Builder *)&list,value_26);
  local_528.ptr = "( un = (\n    struct = (someText = \"foo\") ) )";
  value_13.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
  value_13.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
  value_13.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
  value_13.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
  value_13.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
  value_13.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
  value_13.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
  value_13.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
  prettyPrint(value_13);
  kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
  kj::_::DebugExpression<char_const(&)[45]>::operator==
            ((DebugComparison<const_char_(&)[45],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[45]> *)&local_528,(String *)&l8);
  kj::Array<char>::~Array((Array<char> *)&l8);
  kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    value_14.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
    value_14.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
    value_14.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
    value_14.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
    value_14.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
    value_14.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
    value_14.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
    value_14.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
    prettyPrint(value_14);
    kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
    kj::_::Debug::
    log<char_const(&)[105],kj::_::DebugComparison<char_const(&)[45],kj::String>&,char_const(&)[45],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x239,ERROR,
               "\"failed: expected \" \"(\\\"( un = (\\\\n\\\" \\\"    struct = (someText = \\\\\\\"foo\\\\\\\") ) )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( un = (\\n\" \"    struct = (someText = \\\"foo\\\") ) )\", prettyPrint(root).flatten()"
               ,(char (*) [105])
                "failed: expected (\"( un = (\\n\" \"    struct = (someText = \\\"foo\\\") ) )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[45],_kj::String> *)&_kjCondition,
               (char (*) [45])"( un = (\n    struct = (someText = \"foo\") ) )",(String *)&l8);
    kj::Array<char>::~Array((Array<char> *)&l8);
    kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  value_27.super_StringPtr.content.size_ = 0x21;
  value_27.super_StringPtr.content.ptr = "baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar";
  capnproto_test::capnp::test::TestStructUnion::SomeStruct::Builder::setMoreText
            ((Builder *)&list,value_27);
  local_528.ptr =
       "( un = (\n    struct = (\n      someText = \"foo\",\n      moreText = \"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\" ) ) )"
  ;
  value_15.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
  value_15.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
  value_15.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
  value_15.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
  value_15.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
  value_15.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
  value_15.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
  value_15.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
  prettyPrint(value_15);
  kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
  kj::_::DebugExpression<char_const(&)[106]>::operator==
            ((DebugComparison<const_char_(&)[106],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[106]> *)&local_528,(String *)&l8);
  kj::Array<char>::~Array((Array<char> *)&l8);
  kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    value_16.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa70._0_8_;
    value_16.builder.data = (void *)in_stack_fffffffffffffa70._8_8_;
    value_16.builder.pointers = (WirePointer *)in_stack_fffffffffffffa70._16_8_;
    value_16.builder.dataSize = in_stack_fffffffffffffa70._24_4_;
    value_16.builder.pointerCount = in_stack_fffffffffffffa70._28_2_;
    value_16.builder._38_2_ = in_stack_fffffffffffffa70._30_2_;
    value_16.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa60._0_8_;
    value_16.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa60._8_8_;
    prettyPrint(value_16);
    kj::StringTree::flatten((String *)&l8,(StringTree *)&stack0xfffffffffffffa60);
    kj::_::Debug::
    log<char_const(&)[176],kj::_::DebugComparison<char_const(&)[106],kj::String>&,char_const(&)[106],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(\\\"( un = (\\\\n\\\" \\\"    struct = (\\\\n\\\" \\\"      someText = \\\\\\\"foo\\\\\\\",\\\\n\\\" \\\"      moreText = \\\\\\\"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\\\\\\\" ) ) )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( un = (\\n\" \"    struct = (\\n\" \"      someText = \\\"foo\\\",\\n\" \"      moreText = \\\"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\\\" ) ) )\", prettyPrint(root).flatten()"
               ,(char (*) [176])
                "failed: expected (\"( un = (\\n\" \"    struct = (\\n\" \"      someText = \\\"foo\\\",\\n\" \"      moreText = \\\"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\\\" ) ) )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[106],_kj::String> *)&_kjCondition,
               (char (*) [106])
               "( un = (\n    struct = (\n      someText = \"foo\",\n      moreText = \"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\" ) ) )"
               ,(String *)&l8);
    kj::Array<char>::~Array((Array<char> *)&l8);
    kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffa60);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Stringify, PrettyPrintAdvanced) {
  MallocMessageBuilder builder;

  {
    auto root = builder.initRoot<test::TestPrintInlineStructs>();

    auto list = root.initStructList(3);
    list[0].setInt32Field(123);
    list[0].setTextField("foo");
    list[1].setInt32Field(456);
    list[1].setTextField("bar");
    list[2].setInt32Field(789);
    list[2].setTextField("baz");

    EXPECT_EQ(
        "( structList = [\n"
        "    (int32Field = 123, textField = \"foo\"),\n"
        "    (int32Field = 456, textField = \"bar\"),\n"
        "    (int32Field = 789, textField = \"baz\") ] )",
        prettyPrint(root).flatten());

    root.setSomeText("foo");

    EXPECT_EQ(
        "( someText = \"foo\",\n"
        "  structList = [\n"
        "    (int32Field = 123, textField = \"foo\"),\n"
        "    (int32Field = 456, textField = \"bar\"),\n"
        "    (int32Field = 789, textField = \"baz\") ] )",
        prettyPrint(root).flatten());
  }

  {
    auto root = builder.initRoot<test::TestLists>();
    auto ll = root.initInt32ListList(3);
    ll.set(0, {123, 456, 789, 1234567890});
    ll.set(1, {234, 567, 891, 1234567890});
    ll.set(2, {345, 678, 912, 1234567890});

    EXPECT_EQ(
        "[ [123, 456, 789, 1234567890],\n"
        "  [234, 567, 891, 1234567890],\n"
        "  [345, 678, 912, 1234567890] ]",
        prettyPrint(ll).flatten());

    EXPECT_EQ(
        "( int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());

    root.initList8(0);

    EXPECT_EQ(
        "( list8 = [],\n"
        "  int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());

    auto l8 = root.initList8(1);
    l8[0].setF(12);

    EXPECT_EQ(
        "( list8 = [(f = 12)],\n"
        "  int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());

    l8 = root.initList8(2);
    l8[0].setF(12);
    l8[1].setF(34);

    EXPECT_EQ(
        "( list8 = [(f = 12), (f = 34)],\n"
        "  int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());
  }

  {
    auto root = builder.initRoot<test::TestStructUnion>();

    auto s = root.getUn().initStruct();
    EXPECT_EQ(
        "(un = (struct = ()))",
        prettyPrint(root).flatten());

    s.setSomeText("foo");
    EXPECT_EQ(
        "( un = (\n"
        "    struct = (someText = \"foo\") ) )",
        prettyPrint(root).flatten());

    s.setMoreText("baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar");
    EXPECT_EQ(
        "( un = (\n"
        "    struct = (\n"
        "      someText = \"foo\",\n"
        "      moreText = \"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\" ) ) )",
        prettyPrint(root).flatten());
  }
}